

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_price_field_Test::TestBody
          (PriceUpdateDecoderTest_test_decode_price_field_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  PriceField price_field;
  double price;
  FieldDef field_def;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  AssertHelper local_98;
  internal local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  ByteBuffer local_80 [16];
  double local_70;
  long *local_68 [2];
  long local_58 [2];
  FieldDef local_48 [8];
  long *local_40;
  long local_30 [3];
  
  local_70 = 43.45664;
  bidfx_public_api::tools::Varint::WriteU64
            ((OutputStream *)&(this->super_PriceUpdateDecoderTest).field_0x18,0x2971880);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"field","");
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_48,1,0x44,(string *)local_68,0x56,6);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            (local_80,(FieldDef *)&(this->super_PriceUpdateDecoderTest).buffer);
  local_a0.ptr_._0_4_ = 2;
  local_98.data_._0_4_ = bidfx_public_api::price::PriceField::GetType();
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            (local_90,"PriceField::DOUBLE","price_field.GetType()",(Type *)&local_a0,
             (Type *)&local_98);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_a0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            (local_90,"price","price_field.GetDouble()",&local_70,(double *)&local_a0);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_a0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)local_80);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_price_field)
{
    double price = 43.45664;
    uint64_t priceTimesMillion = 43456640L;
    Varint::WriteU64(buffer, priceTimesMillion);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::DOUBLE, "field", FieldEncodingEnum::VARINT, 6);
    PriceField price_field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::DOUBLE, price_field.GetType());
    EXPECT_EQ(price, price_field.GetDouble());
}